

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::ExtractSubrange
          (RepeatedField<unsigned_int> *this,int start,int num,uint *elements)

{
  uint *puVar1;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int i_1;
  int i;
  undefined4 local_ec;
  undefined4 local_e8;
  int in_stack_ffffffffffffff2c;
  RepeatedField<unsigned_int> *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff7c;
  RepeatedField<unsigned_int> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  RepeatedField<unsigned_int> *in_stack_ffffffffffffff90;
  
  if (in_RCX != 0) {
    for (local_e8 = 0; local_e8 < in_EDX; local_e8 = local_e8 + 1) {
      puVar1 = Get(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      *(uint *)(in_RCX + (long)local_e8 * 4) = *puVar1;
    }
  }
  if (0 < in_EDX) {
    for (local_ec = in_ESI + in_EDX; local_ec < *in_RDI; local_ec = local_ec + 1) {
      Get(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      Set(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(uint *)in_stack_ffffffffffffff80);
    }
    Truncate(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != NULL) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}